

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundStatement.cpp
# Opt level: O1

void __thiscall hdc::CompoundStatement::~CompoundStatement(CompoundStatement *this)

{
  pointer ppSVar1;
  ulong uVar2;
  
  (this->super_Statement).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR_accept_00197f78;
  ppSVar1 = (this->statements).
            super__Vector_base<hdc::Statement_*,_std::allocator<hdc::Statement_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->statements).super__Vector_base<hdc::Statement_*,_std::allocator<hdc::Statement_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppSVar1) {
    uVar2 = 0;
    do {
      if (ppSVar1[uVar2] != (Statement *)0x0) {
        (*(ppSVar1[uVar2]->super_ASTNode)._vptr_ASTNode[2])();
      }
      uVar2 = uVar2 + 1;
      ppSVar1 = (this->statements).
                super__Vector_base<hdc::Statement_*,_std::allocator<hdc::Statement_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->statements).
                                   super__Vector_base<hdc::Statement_*,_std::allocator<hdc::Statement_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3))
    ;
  }
  if (ppSVar1 != (pointer)0x0) {
    operator_delete(ppSVar1);
  }
  Statement::~Statement(&this->super_Statement);
  return;
}

Assistant:

CompoundStatement::~CompoundStatement() {
    for (int i = 0; i < statements.size(); ++i) {
        delete statements[i];
    }
}